

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::closeEvent(QMdiSubWindow *this,QCloseEvent *closeEvent)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  QWidget *this_01;
  bool bVar2;
  int iVar3;
  QCloseEvent QVar4;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  pDVar1 = (this_00->baseWidget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (this_01 = (QWidget *)(this_00->baseWidget).wp.value, this_01 != (QWidget *)0x0)) {
    iVar3 = QWidget::close(this_01,(int)closeEvent);
    if ((char)iVar3 == '\0') {
      QVar4 = (QCloseEvent)0x0;
      goto LAB_00450d6f;
    }
  }
  QMdiSubWindowPrivate::removeButtonsFromMenuBar(this_00);
  QMdiSubWindowPrivate::setActive(this_00,false,true);
  QVar4 = (QCloseEvent)0x1;
  if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) != 0) {
    bVar2 = QWidget::testAttribute_helper(&this->super_QWidget,WA_DeleteOnClose);
    if (bVar2) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QChildEvent::QChildEvent((QChildEvent *)&local_48,ChildRemoved,(QObject *)this);
      QCoreApplication::sendEvent
                (*(QObject **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10),(QEvent *)&local_48
                );
      QChildEvent::~QChildEvent((QChildEvent *)&local_48);
    }
  }
LAB_00450d6f:
  closeEvent[0xc] = QVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::closeEvent(QCloseEvent *closeEvent)
{
    Q_D(QMdiSubWindow);
    bool acceptClose = true;
    if (d->baseWidget)
        acceptClose = d->baseWidget->close();
    if (!acceptClose) {
        closeEvent->ignore();
        return;
    }
#if QT_CONFIG(menubar)
    d->removeButtonsFromMenuBar();
#endif
    d->setActive(false);
    if (parentWidget() && testAttribute(Qt::WA_DeleteOnClose)) {
        QChildEvent childRemoved(QEvent::ChildRemoved, this);
        QCoreApplication::sendEvent(parentWidget(), &childRemoved);
    }
    closeEvent->accept();
}